

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O2

void test_multiple_semaphores_waiting(void)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  shared_ptr<TestCase> *test_case_1;
  pointer psVar5;
  shared_ptr<TestCase> *test_case;
  bool bVar6;
  uint unlocked_after;
  uint timeout;
  shared_ptr<TestCase> local_b8;
  undefined1 local_a8 [32];
  LockstepScheduler ls;
  
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x20] = '\0';
  ls._65_8_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x18] = '\0';
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._25_7_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__align = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ls.time_us_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  LockstepScheduler::set_absolute_time(&ls,0xbc614e);
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = 0;
  timeout = 0x2b67;
  unlocked_after = 0x2b67;
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)&local_b8,(int *)&timeout,(LockstepScheduler *)&unlocked_after);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)local_a8
             ,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  timeout = 20000;
  unlocked_after = 20000;
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)&local_b8,(int *)&timeout,(LockstepScheduler *)&unlocked_after);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)local_a8
             ,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  timeout = 0;
  unlocked_after = 20000;
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)&local_b8,(int *)&timeout,(LockstepScheduler *)&unlocked_after);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)local_a8
             ,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  timeout = 20000;
  unlocked_after = 10000;
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)&local_b8,(int *)&timeout,(LockstepScheduler *)&unlocked_after);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)local_a8
             ,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  timeout = 0;
  unlocked_after = 0;
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)&local_b8,(int *)&timeout,(LockstepScheduler *)&unlocked_after);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)local_a8
             ,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  iVar2 = random_number(1,0x14);
  iVar4 = 0;
  if (0 < iVar2) {
    iVar4 = iVar2;
  }
  while (uVar1 = local_a8._8_8_, bVar6 = iVar4 != 0, iVar4 = iVar4 + -1,
        psVar5 = (pointer)local_a8._0_8_, bVar6) {
    timeout = random_number(1,20000);
    unlocked_after = random_number(1,20000);
    std::make_shared<TestCase,unsigned_int_const&,unsigned_int_const&,LockstepScheduler&>
              ((uint *)&local_b8,&timeout,(LockstepScheduler *)&unlocked_after);
    std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
    emplace_back<std::shared_ptr<TestCase>>
              ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)
               local_a8,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b8.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  for (; psVar5 != (pointer)uVar1; psVar5 = psVar5 + 1) {
    TestCase::run((TestCase *)
                  (psVar5->
                  super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr);
  }
  for (uVar3 = 1; uVar3 < 0x4e85; uVar3 = iVar4 + uVar3) {
    LockstepScheduler::set_absolute_time(&ls,(ulong)(uVar3 + 0xbc614e));
    uVar1 = local_a8._8_8_;
    for (psVar5 = (pointer)local_a8._0_8_; psVar5 != (pointer)uVar1; psVar5 = psVar5 + 1) {
      TestCase::check((TestCase *)
                      (psVar5->
                      super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    }
    iVar4 = random_number(1,100);
  }
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::clear
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             local_a8);
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::~vector
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             local_a8);
  std::
  vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ::~vector(&ls.timed_waits_);
  return;
}

Assistant:

void test_absolute_time()
{
    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);
    assert(ls.get_absolute_time() == some_time_us);
}